

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O0

matrix4x4_f32_t * prf_state_get_inverse_matrix(prf_state_t *state)

{
  undefined4 uVar1;
  float fVar2;
  long lVar3;
  long in_RDI;
  float32_t h_1;
  float32_t h;
  int p [4];
  int k;
  int j;
  int i;
  float32_t (*a) [4];
  float32_t q;
  float32_t s;
  float32_t pivot;
  float32_t max;
  int aiStack_48 [5];
  int local_34;
  int local_30;
  int local_2c;
  long local_28;
  float local_1c;
  float local_14;
  long local_10;
  
  local_10 = in_RDI;
  if (*(int *)(in_RDI + 0x58) != 0) {
    local_28 = *(long *)(in_RDI + 0x50);
    memcpy(*(void **)(in_RDI + 0x50),
           *(void **)(*(long *)(in_RDI + 0x48) + (ulong)*(ushort *)(in_RDI + 0x7e) * 8),0x40);
    for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
      local_14 = 0.0;
      aiStack_48[local_34] = 0;
      for (local_2c = local_34; local_2c < 4; local_2c = local_2c + 1) {
        local_1c = 0.0;
        for (local_30 = local_34; local_30 < 4; local_30 = local_30 + 1) {
          local_1c = ABS(*(float *)(local_28 + (long)local_2c * 0x10 + (long)local_30 * 4)) +
                     local_1c;
        }
        local_1c = ABS(*(float *)(local_28 + (long)local_2c * 0x10 + (long)local_34 * 4)) / local_1c
        ;
        if (local_14 < local_1c) {
          aiStack_48[local_34] = local_2c;
          local_14 = local_1c;
        }
      }
      if ((local_14 == 0.0) && (!NAN(local_14))) {
        return (matrix4x4_f32_t *)0x0;
      }
      if (aiStack_48[local_34] != local_34) {
        for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
          uVar1 = *(undefined4 *)(local_28 + (long)local_34 * 0x10 + (long)local_30 * 4);
          *(undefined4 *)(local_28 + (long)local_34 * 0x10 + (long)local_30 * 4) =
               *(undefined4 *)(local_28 + (long)aiStack_48[local_34] * 0x10 + (long)local_30 * 4);
          *(undefined4 *)(local_28 + (long)aiStack_48[local_34] * 0x10 + (long)local_30 * 4) = uVar1
          ;
        }
      }
      fVar2 = *(float *)(local_28 + (long)local_34 * 0x10 + (long)local_34 * 4);
      for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
        if (local_30 != local_34) {
          *(float *)(local_28 + (long)local_34 * 0x10 + (long)local_30 * 4) =
               -*(float *)(local_28 + (long)local_34 * 0x10 + (long)local_30 * 4) / fVar2;
          for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
            if (local_2c != local_34) {
              lVar3 = local_28 + (long)local_2c * 0x10;
              *(float *)(lVar3 + (long)local_30 * 4) =
                   *(float *)(local_28 + (long)local_2c * 0x10 + (long)local_34 * 4) *
                   *(float *)(local_28 + (long)local_34 * 0x10 + (long)local_30 * 4) +
                   *(float *)(lVar3 + (long)local_30 * 4);
            }
          }
        }
      }
      for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
        lVar3 = local_28 + (long)local_2c * 0x10;
        *(float *)(lVar3 + (long)local_34 * 4) = *(float *)(lVar3 + (long)local_34 * 4) / fVar2;
      }
      *(float *)(local_28 + (long)local_34 * 0x10 + (long)local_34 * 4) = 1.0 / fVar2;
    }
    for (local_34 = 2; -1 < local_34; local_34 = local_34 + -1) {
      if (aiStack_48[local_34] != local_34) {
        for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
          uVar1 = *(undefined4 *)(local_28 + (long)local_2c * 0x10 + (long)local_34 * 4);
          *(undefined4 *)(local_28 + (long)local_2c * 0x10 + (long)local_34 * 4) =
               *(undefined4 *)(local_28 + (long)local_2c * 0x10 + (long)aiStack_48[local_34] * 4);
          *(undefined4 *)(local_28 + (long)local_2c * 0x10 + (long)aiStack_48[local_34] * 4) = uVar1
          ;
        }
      }
    }
    *(undefined4 *)(local_10 + 0x58) = 0;
  }
  return *(matrix4x4_f32_t **)(local_10 + 0x50);
}

Assistant:

matrix4x4_f32_t *
prf_state_get_inverse_matrix(
    prf_state_t * state )
{
    assert( state != NULL );

    if ( state->inv_dirty != FALSE ) {
        float32_t max, pivot, s, q, (*a)[4];
        int i, j, k, p[4];

        a = (float32_t (*)[4]) state->inv_matrix;
        memcpy( state->inv_matrix, state->matrix[ state->state_push_level ],
            sizeof( matrix4x4_f32_t ) ); 

        for ( k = 0; k < 4; k++ ) {
            max = 0.0f;
            p[k] = 0;
            for ( i = k; i < 4; i++ ) {
                s = 0.0;
                for ( j = k; j < 4; j++ )
                    s += (float32_t)fabs( a[i][j] );
                q = (float32_t)fabs( a[i][k] ) / s;
                if ( q > max ) {
                    max = q;
                    p[k] = i;
                }
            }
            if ( max == 0.0f )
                return NULL;
            if ( p[k] != k ) {
                for ( j = 0; j < 4; j++ ) {
                    float32_t h;
                    h = a[k][j];
                    a[k][j] = a[p[k]][j];
                    a[p[k]][j] = h;
                }
            }
            pivot = a[k][k];
            for ( j = 0; j < 4; j++ ) {
                if ( j != k ) {
                    a[k][j] = - a[k][j] / pivot;
                    for ( i = 0; i < 4; i++ )
                        if ( i != k )
                            a[i][j] += a[i][k] * a[k][j];
                }
            }
            for ( i = 0; i < 4; i++ )
                a[i][k] /= pivot;
            a[k][k] = 1 / pivot;
        }
        for ( k = 4 - 2; k >= 0; k-- ) {
            if ( p[k] != k ) {
                for ( i = 0; i < 4; i++ ) {
                    float32_t h;
                    h = a[i][k];
                    a[i][k] = a[i][p[k]];
                    a[i][p[k]] = h;
                }
            }
        }
        state->inv_dirty = FALSE;
    }

    return state->inv_matrix;
}